

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFlateDecodeStream.cpp
# Opt level: O1

LongBufferSizeType __thiscall
OutputFlateDecodeStream::Write
          (OutputFlateDecodeStream *this,Byte *inBuffer,LongBufferSizeType inSize)

{
  z_stream *pzVar1;
  z_streamp strm;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Trace *pTVar4;
  LongBufferSizeType LVar5;
  
  if (this->mCurrentlyEncoding != true) {
    if (this->mTargetStream != (IByteWriter *)0x0) {
      iVar2 = (*this->mTargetStream->_vptr_IByteWriter[2])();
      return CONCAT44(extraout_var,iVar2);
    }
    return 0;
  }
  if (inSize == 0) {
    return 0;
  }
  pzVar1 = this->mZLibState;
  pzVar1->avail_in = (uInt)inSize;
  pzVar1->next_in = inBuffer;
  do {
    strm = this->mZLibState;
    strm->avail_out = 0x40000;
    strm->next_out = this->mBuffer;
    uVar3 = inflate(strm,0);
    if ((uVar3 + 4 < 7) && ((0x47U >> (uVar3 + 4 & 0x1f) & 1) != 0)) {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "OutputFlateDecodeStream::DecodeBufferAndWrite, failed to write zlib information. returned error code = %d"
                        ,(ulong)uVar3);
      inflateEnd(this->mZLibState);
      break;
    }
    iVar2 = (*this->mTargetStream->_vptr_IByteWriter[2])
                      (this->mTargetStream,this->mBuffer,
                       (ulong)(0x40000 - this->mZLibState->avail_out));
    if (CONCAT44(extraout_var_00,iVar2) != (ulong)(0x40000 - this->mZLibState->avail_out)) {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "OutputFlateDecodeStream::DecodeBufferAndWrite, Failed to write the desired amount of zlib bytes to underlying stream. supposed to write %lld, wrote %lld"
                        ,(ulong)(0x40000 - this->mZLibState->avail_out),
                        CONCAT44(extraout_var_00,iVar2));
      inflateEnd(this->mZLibState);
      this->mCurrentlyEncoding = false;
      uVar3 = 0xfffffffe;
      break;
    }
  } while (this->mZLibState->avail_out == 0);
  LVar5 = 0;
  if (uVar3 < 2) {
    LVar5 = inSize;
  }
  return LVar5;
}

Assistant:

LongBufferSizeType OutputFlateDecodeStream::Write(const IOBasicTypes::Byte* inBuffer,LongBufferSizeType inSize)
{
	if(mCurrentlyEncoding)
		return DecodeBufferAndWrite(inBuffer,inSize);
	else if(mTargetStream)
		return mTargetStream->Write(inBuffer,inSize);
	else
		return 0;
}